

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_a.c
# Opt level: O1

void test_option_a(void)

{
  int iVar1;
  wchar_t wVar2;
  char *__ptr;
  long lVar3;
  stat_conflict st;
  utimbuf local_d8;
  stat local_c0;
  
  lVar3 = 0;
  do {
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
                        ,L'1',*(char **)((long)&files[0].name + lVar3),L'Ƥ',L'\xffffffff',"a");
    local_d8.actime = 1;
    local_d8.modtime = 3;
    iVar1 = utime(*(char **)((long)&files[0].name + lVar3),&local_d8);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
                        ,L'>',0,"0",(long)iVar1,"utime(files[i].name, &times)",(void *)0x0);
    iVar1 = stat(*(char **)((long)&files[0].name + lVar3),&local_c0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
                        ,L'C',0,"0",(long)iVar1,"stat(files[i].name, &st)",(void *)0x0);
    *(__time_t *)((long)&files[0].atime_sec + lVar3) = local_c0.st_atim.tv_sec;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x60);
  sleepUntilAfter(files[5].atime_sec);
  __ptr = slurpfile((size_t *)0x0,"f0");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
                   ,L'V',(uint)(__ptr != (char *)0x0),"p != NULL",(void *)0x0);
  free(__ptr);
  iVar1 = stat("f0",&local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
                      ,L'X',0,"0",(long)iVar1,"stat(\"f0\", &st)",(void *)0x0);
  if (local_c0.st_atim.tv_sec == files[0].atime_sec) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
                   ,L'Z');
    test_skipping("Cannot verify -a option\n      Your system appears to not support atime.");
  }
  else {
    wVar2 = systemf("echo %s | %s -pd copy-no-a > copy-no-a.out 2>copy-no-a.err",files[1].name,
                    testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
                        ,L'f',(long)wVar2,"r",0,"0",(void *)0x0);
    assertion_text_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
               ,L'g',"1 block\n","copy-no-a.err");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
               ,L'h',"copy-no-a.out");
    iVar1 = stat(files[1].name,&local_c0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
                        ,L'i',0,"0",(long)iVar1,"stat(files[1].name, &st)",(void *)0x0);
    failure("Copying file without -a should have changed atime.");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
                     ,L'k',(uint)(local_c0.st_atim.tv_sec != files[1].atime_sec),
                     "st.st_atime != files[1].atime_sec",(void *)0x0);
    wVar2 = systemf("echo %s | %s -o > archive-no-a.out 2>archive-no-a.err",files[2].name,testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
                        ,L'o',(long)wVar2,"r",0,"0",(void *)0x0);
    assertion_text_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
               ,L'p',"1 block\n","copy-no-a.err");
    iVar1 = stat(files[2].name,&local_c0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
                        ,L'q',0,"0",(long)iVar1,"stat(files[2].name, &st)",(void *)0x0);
    failure("Archiving file without -a should have changed atime.");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
                     ,L's',(uint)(local_c0.st_atim.tv_sec != files[2].atime_sec),
                     "st.st_atime != files[2].atime_sec",(void *)0x0);
  }
  wVar2 = systemf("echo %s | %s -pad copy-a > copy-a.out 2>copy-a.err",files[3].name,testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
                      ,L'~',(long)wVar2,"r",0,"0",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
             ,L'\x7f',"1 block\n","copy-a.err");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
             ,L'\x80',"copy-a.out");
  iVar1 = stat(files[3].name,&local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
                      ,L'\x81',0,"0",(long)iVar1,"stat(files[3].name, &st)",(void *)0x0);
  failure("Copying file with -a should not have changed atime.");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
                      ,L'\x83',local_c0.st_atim.tv_sec,"st.st_atime",files[3].atime_sec,
                      "files[3].atime_sec",(void *)0x0);
  wVar2 = systemf("echo %s | %s -oa > archive-a.out 2>archive-a.err",files[4].name,testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
                      ,L'\x88',(long)wVar2,"r",0,"0",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
             ,L'\x89',"1 block\n","copy-a.err");
  iVar1 = stat(files[4].name,&local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
                      ,L'\x8a',0,"0",(long)iVar1,"stat(files[4].name, &st)",(void *)0x0);
  failure("Archiving file with -a should not have changed atime.");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_a.c"
                      ,L'\x8c',local_c0.st_atim.tv_sec,"st.st_atime",files[4].atime_sec,
                      "files[4].atime_sec",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_option_a)
{
	struct stat st;
	int r;
	char *p;

	/* Create all of the test files. */
	test_create();

	/* Sanity check; verify that atimes really do get modified. */
	p = slurpfile(NULL, "f0");
	assert(p != NULL);
	free(p);
	assertEqualInt(0, stat("f0", &st));
	if (st.st_atime == files[0].atime_sec) {
		skipping("Cannot verify -a option\n"
		    "      Your system appears to not support atime.");
	}
	else
	{
		/*
		 * If this disk is mounted noatime, then we can't
		 * verify correct operation without -a.
		 */

		/* Copy the file without -a; should change the atime. */
		r = systemf("echo %s | %s -pd copy-no-a > copy-no-a.out 2>copy-no-a.err", files[1].name, testprog);
		assertEqualInt(r, 0);
		assertTextFileContents("1 block\n", "copy-no-a.err");
		assertEmptyFile("copy-no-a.out");
		assertEqualInt(0, stat(files[1].name, &st));
		failure("Copying file without -a should have changed atime.");
		assert(st.st_atime != files[1].atime_sec);

		/* Archive the file without -a; should change the atime. */
		r = systemf("echo %s | %s -o > archive-no-a.out 2>archive-no-a.err", files[2].name, testprog);
		assertEqualInt(r, 0);
		assertTextFileContents("1 block\n", "copy-no-a.err");
		assertEqualInt(0, stat(files[2].name, &st));
		failure("Archiving file without -a should have changed atime.");
		assert(st.st_atime != files[2].atime_sec);
	}

	/*
	 * We can, of course, still verify that the atime is unchanged
	 * when using the -a option.
	 */

	/* Copy the file with -a; should not change the atime. */
	r = systemf("echo %s | %s -pad copy-a > copy-a.out 2>copy-a.err",
	    files[3].name, testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "copy-a.err");
	assertEmptyFile("copy-a.out");
	assertEqualInt(0, stat(files[3].name, &st));
	failure("Copying file with -a should not have changed atime.");
	assertEqualInt(st.st_atime, files[3].atime_sec);

	/* Archive the file with -a; should not change the atime. */
	r = systemf("echo %s | %s -oa > archive-a.out 2>archive-a.err",
	    files[4].name, testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "copy-a.err");
	assertEqualInt(0, stat(files[4].name, &st));
	failure("Archiving file with -a should not have changed atime.");
	assertEqualInt(st.st_atime, files[4].atime_sec);
}